

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O3

string_view bloaty::dwarf::AttrValue::ReadBlock<unsigned_short>(string_view *data)

{
  ulong uVar1;
  string_view sVar2;
  
  if (data->_M_len < 2) {
    Throw("premature EOF reading fixed-length data",0x8d);
  }
  sVar2._M_len = (ulong)*(ushort *)data->_M_str;
  sVar2._M_str = (ushort *)((long)data->_M_str + 2);
  data->_M_str = (char *)sVar2._M_str;
  uVar1 = data->_M_len - 2;
  data->_M_len = uVar1;
  if (sVar2._M_len <= uVar1) {
    data->_M_str = (char *)((long)sVar2._M_str + sVar2._M_len);
    data->_M_len = uVar1 - sVar2._M_len;
    return sVar2;
  }
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

string_view AttrValue::ReadBlock(string_view* data) {
  D len = ReadFixed<D>(data);
  return ReadBytes(len, data);
}